

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall PSEngine::check_win_condition(PSEngine *this,WinCondition *p_win_condition)

{
  string *this_00;
  WinConditionType WVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  pointer pCVar8;
  bool bVar9;
  allocator<char> local_99;
  PSEngine *local_98;
  pointer local_90;
  WinCondition *local_88;
  pointer local_80;
  _Rb_tree_node_base *local_78;
  undefined1 local_70 [64];
  
  local_90 = (this->m_current_level).cells.
             super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar8 = (this->m_current_level).cells.
           super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = this;
  local_88 = p_win_condition;
  local_80 = pCVar8;
  do {
    bVar7 = (byte)pCVar8;
    if (local_90 == local_80) {
LAB_00112bed:
      return (bool)(local_90 == local_80 | bVar7 & 1);
    }
    bVar9 = (p_win_condition->on_object).
            super___shared_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0;
    local_78 = &(local_90->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar4 = false;
    for (p_Var6 = (local_90->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_win_condition = local_88, p_Var6 != local_78;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if ((!bVar9) &&
         (peVar2 = (local_88->on_object).
                   super___shared_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         iVar5 = (*peVar2->_vptr_Object[7])(peVar2,p_Var6 + 1), (char)iVar5 != '\0')) {
        bVar9 = true;
      }
      peVar2 = (p_win_condition->object).
               super___shared_ptr<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (*peVar2->_vptr_Object[7])(peVar2,p_Var6 + 1);
      if ((char)iVar5 != '\0') {
        bVar4 = true;
      }
    }
    WVar1 = local_88->type;
    if (WVar1 == All) {
      if ((bVar4) && (!bVar9)) {
LAB_00112be2:
        bVar7 = 0;
        goto LAB_00112bed;
      }
    }
    else {
      this_00 = (string *)(local_70 + 0x20);
      if (WVar1 == Some) {
        if ((bVar9) && (bVar4)) {
          bVar7 = 1;
          goto LAB_00112bed;
        }
      }
      else if (WVar1 == No) {
        if ((bVar9) && (bVar4)) goto LAB_00112be2;
      }
      else if ((int)(local_98->m_config).log_verbosity < 5) {
        peVar3 = (local_98->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string(this_00,(string *)&m_engine_log_cat_abi_cxx11_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_70,"should not happen",&local_99);
        pCVar8 = (pointer)local_70;
        (*peVar3->_vptr_PSLogger[2])(peVar3,4,this_00);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string(this_00);
        if ((local_98->m_config).log_operation_history_after_error == true) {
          print_operation_history(local_98);
        }
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

bool PSEngine::check_win_condition(const CompiledGame::WinCondition& p_win_condition)
{
    for(const auto & cell : m_current_level.cells)
    {

        bool on_object_found = p_win_condition.on_object == nullptr;
        bool object_found = false;
        for(const auto& cell_content : cell.objects)
        {
            if(!on_object_found && p_win_condition.on_object->defines(cell_content.first))
            {
                on_object_found = true;
            }
            if(p_win_condition.object->defines(cell_content.first))
            {
                object_found = true;
            }
        }

        switch (p_win_condition.type)
        {
        case CompiledGame::WinConditionType::Some:
            if(on_object_found && object_found)
            {
                return true;
            }
            break;
        case CompiledGame::WinConditionType::No:
            if(on_object_found && object_found)
            {
                return false;
            }
            break;
        case CompiledGame::WinConditionType::All:
            if(object_found && !on_object_found)
            {
                return false;
            }
            break;
        default:
            PS_LOG_ERROR("should not happen");
            break;
        }
    }
    return true;
}